

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

bool __thiscall
mocker::detail::InterferenceGraph::conservative(InterferenceGraph *this,Node *x,Node *y)

{
  const_iterator cVar1;
  shared_ptr<mocker::nasm::Register> *x_1;
  pointer psVar2;
  __node_base _Var3;
  ulong uVar4;
  bool bVar5;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  neighborsOfX;
  RegSet neighbors;
  undefined1 local_8a;
  undefined1 local_89;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_88;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_70;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  getCurAdjList(&local_70,this,x);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_58,
             local_70.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_70.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0,&local_88,&local_89,&local_8a);
  getCurAdjList(&local_88,this,y);
  if (local_88.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = local_88.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<std::shared_ptr<mocker::nasm::Register>const&>
                ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_58,psVar2);
      psVar2 = psVar2 + 1;
    } while (psVar2 != local_88.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_88);
  if (local_58._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    bVar5 = true;
  }
  else {
    uVar4 = 0;
    _Var3._M_nxt = local_58._M_before_begin._M_nxt;
    do {
      cVar1 = std::
              _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->curDegree)._M_h,(key_type *)(_Var3._M_nxt + 1));
      if (cVar1.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      uVar4 = (uVar4 + 1) -
              (ulong)(*(ulong *)((long)cVar1.
                                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                                       ._M_cur + 0x18) < 0xe);
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
    bVar5 = uVar4 < 0xe;
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_70);
  return bVar5;
}

Assistant:

bool InterferenceGraph::conservative(const Node &x, const Node &y) const {
  auto neighborsOfX = getCurAdjList(x);
  RegSet neighbors(neighborsOfX.begin(), neighborsOfX.end());
  unionSet(neighbors, getCurAdjList(y));
  std::size_t k = 0;
  for (auto &m : neighbors) {
    if (curDegree.at(m) >= K)
      ++k;
  }
  return k < K;
}